

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstrcutStageMeta
          (Impl *this,FieldValuePairVector *fvs,StageMetas *metas)

{
  undefined8 *puVar1;
  vtable_type *pvVar2;
  storage_t<double> sVar3;
  storage_t<double> sVar4;
  storage_t<double> sVar5;
  storage_t<double> sVar6;
  storage_t<double> sVar7;
  storage_t<double> sVar8;
  storage_t<double> sVar9;
  undefined8 uVar10;
  undefined1 *puVar11;
  storage_t<double> sVar12;
  undefined8 uVar13;
  undefined1 auVar14 [8];
  storage_t<bool> sVar15;
  int iVar16;
  ostream *poVar17;
  storage_t<double> *psVar18;
  long *plVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  ulong uVar21;
  size_type *psVar22;
  storage_t<double> sVar23;
  bool *pbVar24;
  long lVar25;
  storage_t<double> sVar26;
  char *pcVar27;
  storage_t<double> sVar28;
  string sVar29;
  long lVar30;
  pointer __rhs;
  ulong uVar31;
  bool bVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> vs;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v;
  ostringstream ss_w;
  vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> subLayerOffsets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subLayers;
  bool local_369;
  string local_368;
  storage_t<double> local_348;
  storage_t<double> sStack_340;
  storage_t<double> local_338;
  storage_t<double> sStack_330;
  undefined8 uStack_328;
  undefined1 local_318 [8];
  undefined1 local_310 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  Impl *local_2d8;
  StageMetas *local_2d0;
  string local_2c8;
  uint local_2a4;
  undefined1 local_2a0 [8];
  undefined1 local_298 [16];
  undefined1 auStack_288 [8];
  string asStack_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  double local_260;
  double local_258;
  ios_base local_230 [264];
  vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> local_128;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  storage_t<double> local_d8;
  storage_t<double> local_d0;
  string local_c8;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  storage_t<double> local_90;
  storage_t<double> local_88;
  bool *local_80;
  string *local_78;
  bool *local_70;
  string *local_68;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *local_60;
  CustomDataType *local_58;
  string *local_50;
  undefined8 local_48;
  undefined8 local_40;
  pointer local_38;
  
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __rhs = (fvs->
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (fvs->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_369 = __rhs == local_38;
  local_2d8 = this;
  local_2d0 = metas;
  if (!local_369) {
    sVar12 = (storage_t<double>)((long)local_308._M_local_buf + 8);
    local_78 = (string *)&metas->comment;
    local_80 = &(metas->comment).is_triple_quoted;
    local_68 = (string *)&metas->doc;
    local_70 = &(metas->doc).is_triple_quoted;
    local_60 = &metas->primChildren;
    local_58 = &metas->customLayerData;
    local_50 = (string *)&metas->defaultPrim;
    local_2a4 = (uint)local_50;
    do {
      iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
      if (iVar16 == 0) {
        crate::CrateValue::get_value<tinyusdz::Token>
                  ((optional<tinyusdz::Token> *)local_2a0,&__rhs->second);
        local_318[0] = (string)local_2a0[0];
        if (local_2a0[0] == (ostringstream)0x1) {
          if ((undefined1 *)local_298._0_8_ == auStack_288) {
            paStack_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(asStack_280._4_4_,
                                      CONCAT22(asStack_280._2_2_,
                                               CONCAT11(asStack_280[1],asStack_280[0])));
            local_310 = (undefined1  [8])sVar12;
          }
          else {
            local_310 = (undefined1  [8])local_298._0_8_;
          }
          local_308._8_8_ = auStack_288;
          local_308._M_allocated_capacity = local_298._8_8_;
          local_298._8_8_ = (storage_t<double>)0x0;
          auStack_288 = (undefined1  [8])((ulong)auStack_288 & 0xffffffffffffff00);
          local_298._0_8_ = auStack_288;
        }
        if (local_2a0[0] != (ostringstream)0x0) {
          local_348 = (storage_t<double>)&local_338;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_348,local_310,
                     local_308._M_allocated_capacity + (long)local_310);
          iVar16 = ::std::__cxx11::string::compare((char *)&local_348);
          if (iVar16 == 0) {
            if ((local_2d0->upAxis)._attrib.has_value_ == false) {
              (local_2d0->upAxis)._attrib.contained = (storage_t<tinyusdz::Axis>)0x1;
LAB_00183564:
              (local_2d0->upAxis)._attrib.has_value_ = true;
            }
            else {
              (local_2d0->upAxis)._attrib.contained = (storage_t<tinyusdz::Axis>)0x1;
            }
          }
          else {
            iVar16 = ::std::__cxx11::string::compare((char *)&local_348);
            if (iVar16 == 0) {
              if ((local_2d0->upAxis)._attrib.has_value_ == false) {
                (local_2d0->upAxis)._attrib.contained = (storage_t<tinyusdz::Axis>)0x2;
                goto LAB_00183564;
              }
              (local_2d0->upAxis)._attrib.contained = (storage_t<tinyusdz::Axis>)0x2;
            }
            else {
              iVar16 = ::std::__cxx11::string::compare((char *)&local_348);
              if (iVar16 != 0) {
                paVar20 = &local_368.field_2;
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
                poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0x60f);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                ::std::operator+(&local_2c8,"`upAxis` must be \'X\', \'Y\' or \'Z\' but got \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_348);
                plVar19 = (long *)::std::__cxx11::string::append((char *)&local_2c8);
                psVar22 = (size_type *)(plVar19 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar19 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar22) {
                  local_368.field_2._M_allocated_capacity = *psVar22;
                  local_368.field_2._8_8_ = plVar19[3];
                  local_368._M_dataplus._M_p = (pointer)paVar20;
                }
                else {
                  local_368.field_2._M_allocated_capacity = *psVar22;
                  local_368._M_dataplus._M_p = (pointer)*plVar19;
                }
                local_368._M_string_length = plVar19[1];
                *plVar19 = (long)psVar22;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2a0,local_368._M_dataplus._M_p,
                                     local_368._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_dataplus._M_p != paVar20) {
                  operator_delete(local_368._M_dataplus._M_p,
                                  local_368.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                  operator_delete(local_2c8._M_dataplus._M_p,
                                  CONCAT44(local_2c8.field_2._M_allocated_capacity._4_4_,
                                           local_2c8.field_2._M_allocated_capacity._0_4_) + 1);
                }
                ::std::__cxx11::stringbuf::str();
                PushError(local_2d8,&local_368);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_dataplus._M_p != paVar20) {
                  operator_delete(local_368._M_dataplus._M_p,
                                  local_368.field_2._M_allocated_capacity + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
                ::std::ios_base::~ios_base(local_230);
                if (local_348 != (storage_t<double>)&local_338) {
                  operator_delete((void *)local_348,(long)local_338 + 1);
                }
                goto joined_r0x00185d98;
              }
              if ((local_2d0->upAxis)._attrib.has_value_ == false) {
                (local_2d0->upAxis)._attrib.contained = (storage_t<tinyusdz::Axis>)0x0;
                goto LAB_00183564;
              }
              (local_2d0->upAxis)._attrib.contained = (storage_t<tinyusdz::Axis>)0x0;
            }
          }
          sVar23 = local_338;
          sVar26 = local_348;
          if (local_348 != (storage_t<double>)&local_338) {
LAB_0018357f:
            operator_delete((void *)sVar26,(long)sVar23 + 1);
          }
LAB_00183587:
          if ((local_318[0] == (string)0x1) && ((storage_t<double>)local_310 != sVar12)) {
            operator_delete((void *)local_310,local_308._8_8_ + 1);
          }
          goto LAB_00184189;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
        poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0x603);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
        pcVar27 = "`upAxis` must be `token` type.";
        lVar30 = 0x1e;
LAB_00185b0a:
        poVar17 = (ostream *)local_2a0;
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar27,lVar30);
LAB_00185b21:
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(local_2d8,(string *)&local_348);
        if (local_348 != (storage_t<double>)&local_338) {
          operator_delete((void *)local_348,(long)local_338 + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
        ::std::ios_base::~ios_base(local_230);
LAB_00185b86:
joined_r0x00185d98:
        if ((local_318[0] == (string)0x1) && ((storage_t<double>)local_310 != sVar12)) {
          operator_delete((void *)local_310,local_308._8_8_ + 1);
        }
        goto LAB_00185a22;
      }
      iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
      if (iVar16 == 0) {
        tinyusdz::value::Value::get_value<float>
                  ((optional<float> *)local_2a0,&(__rhs->second).value_,false);
        if (local_2a0[0] != (ostringstream)0x0) {
          local_fc = (float)local_2a0._4_4_;
        }
        if (local_2a0[0] == (ostringstream)0x1) {
          if ((local_2d0->metersPerUnit)._attrib.has_value_ == false) {
            (local_2d0->metersPerUnit)._attrib.contained = (storage_t<double>)(double)local_fc;
            (local_2d0->metersPerUnit)._attrib.has_value_ = true;
          }
          else {
            (local_2d0->metersPerUnit)._attrib.contained = (storage_t<double>)(double)local_fc;
          }
          goto LAB_00184189;
        }
        tinyusdz::value::Value::get_value<double>
                  ((optional<double> *)local_2a0,&(__rhs->second).value_,false);
        sVar29 = (string)local_2a0[0];
        if (local_2a0[0] != (ostringstream)0x0) {
          local_d0 = (storage_t<double>)local_298._0_8_;
        }
        if (local_2a0[0] == (ostringstream)0x1) {
          if ((local_2d0->metersPerUnit)._attrib.has_value_ == false) {
            (local_2d0->metersPerUnit)._attrib.contained = local_d0;
            (local_2d0->metersPerUnit)._attrib.has_value_ = true;
          }
          else {
            (local_2d0->metersPerUnit)._attrib.contained = local_d0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
          poVar17 = (ostream *)
                    ::std::ostream::operator<<
                              ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                *)local_2a0,0x61b);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
          pvVar2 = (__rhs->second).value_.v_.vtable;
          if (pvVar2 == (vtable_type *)0x0) {
            local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
            local_368._M_string_length = 4;
            local_368.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
          }
          else {
            (*pvVar2->type_name)(&local_368);
          }
          pcVar27 = "`metersPerUnit` value must be double or float type, but got \'";
LAB_00184008:
          psVar18 = (storage_t<double> *)
                    ::std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,(ulong)pcVar27);
          local_348 = (storage_t<double>)&local_338;
          sVar23 = (storage_t<double>)(psVar18 + 2);
          if (*psVar18 == sVar23) {
            local_338 = *(storage_t<double> *)sVar23;
            sStack_330 = psVar18[3];
          }
          else {
            local_338 = *(storage_t<double> *)sVar23;
            local_348 = *psVar18;
          }
          sStack_340 = psVar18[1];
          *psVar18 = sVar23;
          psVar18[1] = (storage_t<double>)0x0;
          *(undefined1 *)(psVar18 + 2) = 0;
LAB_00184055:
          plVar19 = (long *)::std::__cxx11::string::append((char *)&local_348);
          psVar18 = (storage_t<double> *)(plVar19 + 2);
          if ((storage_t<double> *)*plVar19 == psVar18) {
            local_308._M_allocated_capacity = (size_type)*psVar18;
            local_308._8_8_ = *(storage_t<double> *)(plVar19 + 3);
            local_318 = (undefined1  [8])(local_310 + 8);
          }
          else {
            local_308._M_allocated_capacity = (size_type)*psVar18;
            local_318 = (undefined1  [8])*plVar19;
          }
          local_310 = *(undefined1 (*) [8])(plVar19 + 1);
          *plVar19 = (long)psVar18;
          plVar19[1] = 0;
          *(undefined1 *)(plVar19 + 2) = 0;
          poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a0,(char *)local_318,(long)local_310);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
          if (local_318 != (undefined1  [8])(local_310 + 8)) {
            operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
          }
          if (local_348 != (storage_t<double>)&local_338) {
            operator_delete((void *)local_348,(long)local_338 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::stringbuf::str();
          PushError(local_2d8,(string *)local_318);
          if (local_318 != (undefined1  [8])(local_310 + 8)) {
            operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
          ::std::ios_base::~ios_base(local_230);
        }
LAB_00184180:
        if (sVar29 == (string)0x0) goto LAB_00185a22;
      }
      else {
        iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
        if (iVar16 == 0) {
          tinyusdz::value::Value::get_value<float>
                    ((optional<float> *)local_2a0,&(__rhs->second).value_,false);
          if (local_2a0[0] != (ostringstream)0x0) {
            local_100 = (float)local_2a0._4_4_;
          }
          if (local_2a0[0] == (ostringstream)0x1) {
            if ((local_2d0->kilogramsPerUnit)._attrib.has_value_ == false) {
              (local_2d0->kilogramsPerUnit)._attrib.contained = (storage_t<double>)(double)local_100
              ;
              (local_2d0->kilogramsPerUnit)._attrib.has_value_ = true;
            }
            else {
              (local_2d0->kilogramsPerUnit)._attrib.contained = (storage_t<double>)(double)local_100
              ;
            }
            goto LAB_00184189;
          }
          tinyusdz::value::Value::get_value<double>
                    ((optional<double> *)local_2a0,&(__rhs->second).value_,false);
          sVar29 = (string)local_2a0[0];
          if (local_2a0[0] == (ostringstream)0x0) {
            uVar33 = (undefined4)local_40;
            uVar34 = (undefined4)((ulong)local_40 >> 0x20);
          }
          else {
            uVar33 = (undefined4)local_298._0_8_;
            uVar34 = SUB84(local_298._0_8_,4);
          }
          local_40 = CONCAT44(uVar34,uVar33);
          if (local_2a0[0] != (ostringstream)0x1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
            poVar17 = (ostream *)
                      ::std::ostream::operator<<
                                ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                  *)local_2a0,0x626);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            pvVar2 = (__rhs->second).value_.v_.vtable;
            if (pvVar2 == (vtable_type *)0x0) {
              local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
              local_368._M_string_length = 4;
              local_368.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
            }
            else {
              (*pvVar2->type_name)(&local_368);
            }
            pcVar27 = "`kilogramsPerUnit` value must be double or float type, but got \'";
            goto LAB_00184008;
          }
          if ((local_2d0->kilogramsPerUnit)._attrib.has_value_ == false) {
            sVar23._4_4_ = uVar34;
            sVar23._0_4_ = uVar33;
            (local_2d0->kilogramsPerUnit)._attrib.contained = sVar23;
            (local_2d0->kilogramsPerUnit)._attrib.has_value_ = true;
          }
          else {
            sVar26._4_4_ = uVar34;
            sVar26._0_4_ = uVar33;
            (local_2d0->kilogramsPerUnit)._attrib.contained = sVar26;
          }
          goto LAB_00184180;
        }
        iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
        if (iVar16 == 0) {
          tinyusdz::value::Value::get_value<float>
                    ((optional<float> *)local_2a0,&(__rhs->second).value_,false);
          if (local_2a0[0] != (ostringstream)0x0) {
            local_104 = (float)local_2a0._4_4_;
          }
          if (local_2a0[0] == (ostringstream)0x1) {
            if ((local_2d0->timeCodesPerSecond)._attrib.has_value_ == false) {
              (local_2d0->timeCodesPerSecond)._attrib.contained =
                   (storage_t<double>)(double)local_104;
              (local_2d0->timeCodesPerSecond)._attrib.has_value_ = true;
            }
            else {
              (local_2d0->timeCodesPerSecond)._attrib.contained =
                   (storage_t<double>)(double)local_104;
            }
            goto LAB_00184189;
          }
          tinyusdz::value::Value::get_value<double>
                    ((optional<double> *)local_2a0,&(__rhs->second).value_,false);
          sVar29 = (string)local_2a0[0];
          if (local_2a0[0] == (ostringstream)0x0) {
            uVar33 = (undefined4)local_48;
            uVar34 = (undefined4)((ulong)local_48 >> 0x20);
          }
          else {
            uVar33 = (undefined4)local_298._0_8_;
            uVar34 = SUB84(local_298._0_8_,4);
          }
          local_48 = CONCAT44(uVar34,uVar33);
          if (local_2a0[0] != (ostringstream)0x1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
            poVar17 = (ostream *)
                      ::std::ostream::operator<<
                                ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                  *)local_2a0,0x632);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            pvVar2 = (__rhs->second).value_.v_.vtable;
            if (pvVar2 == (vtable_type *)0x0) {
              local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
              local_368._M_string_length = 4;
              local_368.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
            }
            else {
              (*pvVar2->type_name)(&local_368);
            }
            pcVar27 = "`timeCodesPerSecond` value must be double or float type, but got \'";
            goto LAB_00184008;
          }
          if ((local_2d0->timeCodesPerSecond)._attrib.has_value_ == false) {
            sVar28._4_4_ = uVar34;
            sVar28._0_4_ = uVar33;
            (local_2d0->timeCodesPerSecond)._attrib.contained = sVar28;
            (local_2d0->timeCodesPerSecond)._attrib.has_value_ = true;
          }
          else {
            sVar9._4_4_ = uVar34;
            sVar9._0_4_ = uVar33;
            (local_2d0->timeCodesPerSecond)._attrib.contained = sVar9;
          }
          goto LAB_00184180;
        }
        iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
        if (iVar16 == 0) {
          tinyusdz::value::Value::get_value<float>
                    ((optional<float> *)local_2a0,&(__rhs->second).value_,false);
          if (local_2a0[0] != (ostringstream)0x0) {
            local_108 = (float)local_2a0._4_4_;
          }
          if (local_2a0[0] == (ostringstream)0x1) {
            if ((local_2d0->startTimeCode)._attrib.has_value_ == false) {
              (local_2d0->startTimeCode)._attrib.contained = (storage_t<double>)(double)local_108;
              (local_2d0->startTimeCode)._attrib.has_value_ = true;
            }
            else {
              (local_2d0->startTimeCode)._attrib.contained = (storage_t<double>)(double)local_108;
            }
            goto LAB_00184189;
          }
          tinyusdz::value::Value::get_value<double>
                    ((optional<double> *)local_2a0,&(__rhs->second).value_,false);
          sVar29 = (string)local_2a0[0];
          if (local_2a0[0] == (ostringstream)0x0) {
            uVar33 = (undefined4)local_98;
            uVar34 = (undefined4)((ulong)local_98 >> 0x20);
          }
          else {
            uVar33 = (undefined4)local_298._0_8_;
            uVar34 = SUB84(local_298._0_8_,4);
          }
          local_98 = CONCAT44(uVar34,uVar33);
          if (local_2a0[0] != (ostringstream)0x1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
            poVar17 = (ostream *)
                      ::std::ostream::operator<<
                                ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                  *)local_2a0,0x63e);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            pvVar2 = (__rhs->second).value_.v_.vtable;
            if (pvVar2 == (vtable_type *)0x0) {
              local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
              local_368._M_string_length = 4;
              local_368.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
            }
            else {
              (*pvVar2->type_name)(&local_368);
            }
            pcVar27 = "`startTimeCode` value must be double or float type, but got \'";
            goto LAB_00184008;
          }
          if ((local_2d0->startTimeCode)._attrib.has_value_ == false) {
            sVar8._4_4_ = uVar34;
            sVar8._0_4_ = uVar33;
            (local_2d0->startTimeCode)._attrib.contained = sVar8;
            (local_2d0->startTimeCode)._attrib.has_value_ = true;
          }
          else {
            sVar7._4_4_ = uVar34;
            sVar7._0_4_ = uVar33;
            (local_2d0->startTimeCode)._attrib.contained = sVar7;
          }
          goto LAB_00184180;
        }
        iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
        if (iVar16 == 0) {
          crate::CrateValue::
          get_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_2a0,&__rhs->second);
          local_318[0] = (string)local_2a0[0];
          if (local_2a0[0] == (ostringstream)0x1) {
            local_310 = (undefined1  [8])local_298._0_8_;
            local_308._M_allocated_capacity = local_298._8_8_;
            local_308._8_8_ = auStack_288;
            local_298._0_8_ = (storage_t<double>)0x0;
            local_298._8_8_ = (storage_t<double>)0x0;
            auStack_288 = (undefined1  [8])0x0;
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_298);
          }
          sVar29 = local_318[0];
          if (local_318[0] == (string)0x1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(&local_f8,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_310);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
            poVar17 = (ostream *)
                      ::std::ostream::operator<<
                                ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                  *)local_2a0,0x648);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            pvVar2 = (__rhs->second).value_.v_.vtable;
            if (pvVar2 == (vtable_type *)0x0) {
              local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
              local_2c8.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
              local_2c8._M_string_length = 4;
              local_2c8.field_2._M_allocated_capacity._4_4_ =
                   local_2c8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            }
            else {
              (*pvVar2->type_name)(&local_2c8);
            }
            plVar19 = (long *)::std::__cxx11::string::replace
                                        ((ulong)&local_2c8,0,(char *)0x0,0x3f8af1);
            psVar22 = (size_type *)(plVar19 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar19 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar22) {
              local_368.field_2._M_allocated_capacity = *psVar22;
              local_368.field_2._8_8_ = plVar19[3];
              local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
            }
            else {
              local_368.field_2._M_allocated_capacity = *psVar22;
              local_368._M_dataplus._M_p = (pointer)*plVar19;
            }
            local_368._M_string_length = plVar19[1];
            *plVar19 = (long)psVar22;
            plVar19[1] = 0;
            *(undefined1 *)(plVar19 + 2) = 0;
            psVar18 = (storage_t<double> *)::std::__cxx11::string::append((char *)&local_368);
            sVar23 = (storage_t<double>)(psVar18 + 2);
            if (*psVar18 == sVar23) {
              local_338 = *(storage_t<double> *)sVar23;
              sStack_330 = psVar18[3];
              local_348 = (storage_t<double>)&local_338;
            }
            else {
              local_338 = *(storage_t<double> *)sVar23;
              local_348 = *psVar18;
            }
            sStack_340 = psVar18[1];
            *psVar18 = sVar23;
            psVar18[1] = (storage_t<double>)0x0;
            *(undefined1 *)(psVar18 + 2) = 0;
            poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,(char *)local_348,(long)sStack_340);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
            if (local_348 != (storage_t<double>)&local_338) {
              operator_delete((void *)local_348,(long)local_338 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_dataplus._M_p != &local_368.field_2) {
              operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
              operator_delete(local_2c8._M_dataplus._M_p,
                              CONCAT44(local_2c8.field_2._M_allocated_capacity._4_4_,
                                       local_2c8.field_2._M_allocated_capacity._0_4_) + 1);
            }
            ::std::__cxx11::stringbuf::str();
            PushError(local_2d8,(string *)&local_348);
            if (local_348 != (storage_t<double>)&local_338) {
              operator_delete((void *)local_348,(long)local_338 + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
            ::std::ios_base::~ios_base(local_230);
          }
          if (local_318[0] == (string)0x1) {
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_310);
          }
          goto LAB_00184180;
        }
        iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
        if (iVar16 == 0) {
          tinyusdz::value::Value::
          get_value<std::vector<tinyusdz::LayerOffset,std::allocator<tinyusdz::LayerOffset>>>
                    ((optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>
                      *)local_2a0,&(__rhs->second).value_,false);
          auVar14 = auStack_288;
          uVar13 = local_298._8_8_;
          uVar10 = local_298._0_8_;
          sVar23 = local_d8;
          sVar26 = local_88;
          sVar28 = local_90;
          if (local_2a0[0] == (ostringstream)0x1) {
            local_298._0_8_ = (storage_t<double>)0x0;
            local_298._8_8_ = (storage_t<double>)0x0;
            auStack_288 = (undefined1  [8])0x0;
            sVar23 = (storage_t<double>)uVar10;
            sVar26 = (storage_t<double>)uVar13;
            sVar28 = (storage_t<double>)auVar14;
          }
          local_318[0] = (string)local_2a0[0];
          local_d8 = sVar23;
          local_88 = sVar26;
          local_90 = sVar28;
          if (local_2a0[0] != (ostringstream)0x0) {
            local_90 = (storage_t<double>)0x0;
            local_88 = (storage_t<double>)0x0;
            local_d8 = (storage_t<double>)0x0;
            local_310 = (undefined1  [8])sVar23;
            local_308._M_allocated_capacity = (size_type)sVar26;
            local_308._8_8_ = sVar28;
          }
          if (((byte)local_2a0[0] & local_d8 != (storage_t<double>)0x0) == 1) {
            operator_delete((void *)local_d8,(long)local_90 - (long)local_d8);
          }
          sVar29 = local_318[0];
          if (local_318[0] == (string)0x1) {
            ::std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>::operator=
                      (&local_128,
                       (vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> *)
                       local_310);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
            poVar17 = (ostream *)
                      ::std::ostream::operator<<
                                ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                  *)local_2a0,0x651);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
            pvVar2 = (__rhs->second).value_.v_.vtable;
            if (pvVar2 == (vtable_type *)0x0) {
              local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
              local_2c8.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
              local_2c8._M_string_length = 4;
              local_2c8.field_2._M_allocated_capacity._4_4_ =
                   local_2c8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            }
            else {
              (*pvVar2->type_name)(&local_2c8);
            }
            plVar19 = (long *)::std::__cxx11::string::replace
                                        ((ulong)&local_2c8,0,(char *)0x0,0x3f8b34);
            psVar22 = (size_type *)(plVar19 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar19 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar22) {
              local_368.field_2._M_allocated_capacity = *psVar22;
              local_368.field_2._8_8_ = plVar19[3];
              local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
            }
            else {
              local_368.field_2._M_allocated_capacity = *psVar22;
              local_368._M_dataplus._M_p = (pointer)*plVar19;
            }
            local_368._M_string_length = plVar19[1];
            *plVar19 = (long)psVar22;
            plVar19[1] = 0;
            *(undefined1 *)(plVar19 + 2) = 0;
            psVar18 = (storage_t<double> *)::std::__cxx11::string::append((char *)&local_368);
            sVar23 = (storage_t<double>)(psVar18 + 2);
            if (*psVar18 == sVar23) {
              local_338 = *(storage_t<double> *)sVar23;
              sStack_330 = psVar18[3];
              local_348 = (storage_t<double>)&local_338;
            }
            else {
              local_338 = *(storage_t<double> *)sVar23;
              local_348 = *psVar18;
            }
            sStack_340 = psVar18[1];
            *psVar18 = sVar23;
            psVar18[1] = (storage_t<double>)0x0;
            *(undefined1 *)(psVar18 + 2) = 0;
            poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,(char *)local_348,(long)sStack_340);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
            if (local_348 != (storage_t<double>)&local_338) {
              operator_delete((void *)local_348,(long)local_338 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_dataplus._M_p != &local_368.field_2) {
              operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
              operator_delete(local_2c8._M_dataplus._M_p,
                              CONCAT44(local_2c8.field_2._M_allocated_capacity._4_4_,
                                       local_2c8.field_2._M_allocated_capacity._0_4_) + 1);
            }
            ::std::__cxx11::stringbuf::str();
            PushError(local_2d8,(string *)&local_348);
            if (local_348 != (storage_t<double>)&local_338) {
              operator_delete((void *)local_348,(long)local_338 + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
            ::std::ios_base::~ios_base(local_230);
          }
          if ((local_318[0] == (string)0x1) &&
             ((storage_t<double>)local_310 != (storage_t<double>)0x0)) {
            uVar21 = local_308._8_8_ - (long)local_310;
LAB_001843ff:
            operator_delete((void *)local_310,uVar21);
          }
          goto LAB_00184180;
        }
        iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
        if (iVar16 == 0) {
          tinyusdz::value::Value::get_value<float>
                    ((optional<float> *)local_2a0,&(__rhs->second).value_,false);
          if (local_2a0[0] != (ostringstream)0x0) {
            local_10c = (float)local_2a0._4_4_;
          }
          if (local_2a0[0] != (ostringstream)0x1) {
            tinyusdz::value::Value::get_value<double>
                      ((optional<double> *)local_2a0,&(__rhs->second).value_,false);
            sVar29 = (string)local_2a0[0];
            if (local_2a0[0] == (ostringstream)0x0) {
              uVar33 = (undefined4)local_a0;
              uVar34 = (undefined4)((ulong)local_a0 >> 0x20);
            }
            else {
              uVar33 = (undefined4)local_298._0_8_;
              uVar34 = SUB84(local_298._0_8_,4);
            }
            local_a0 = CONCAT44(uVar34,uVar33);
            if (local_2a0[0] != (ostringstream)0x1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2a0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
              poVar17 = (ostream *)
                        ::std::ostream::operator<<
                                  ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                    *)local_2a0,0x65c);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
              pvVar2 = (__rhs->second).value_.v_.vtable;
              if (pvVar2 == (vtable_type *)0x0) {
                local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
                local_368._M_string_length = 4;
                local_368.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
              }
              else {
                (*pvVar2->type_name)(&local_368);
              }
              pcVar27 = "`endTimeCode` value must be double or float type, but got \'";
LAB_00184895:
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_348,pcVar27,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_368);
              goto LAB_00184055;
            }
            if ((local_2d0->endTimeCode)._attrib.has_value_ == false) {
              sVar6._4_4_ = uVar34;
              sVar6._0_4_ = uVar33;
              (local_2d0->endTimeCode)._attrib.contained = sVar6;
              (local_2d0->endTimeCode)._attrib.has_value_ = true;
            }
            else {
              sVar5._4_4_ = uVar34;
              sVar5._0_4_ = uVar33;
              (local_2d0->endTimeCode)._attrib.contained = sVar5;
            }
            goto LAB_00184180;
          }
          if ((local_2d0->endTimeCode)._attrib.has_value_ == false) {
            (local_2d0->endTimeCode)._attrib.contained = (storage_t<double>)(double)local_10c;
            (local_2d0->endTimeCode)._attrib.has_value_ = true;
          }
          else {
            (local_2d0->endTimeCode)._attrib.contained = (storage_t<double>)(double)local_10c;
          }
        }
        else {
          iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
          if (iVar16 != 0) {
            iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
            if (iVar16 == 0) {
              tinyusdz::value::Value::get_value<bool>((Value *)local_2a0,SUB81(&__rhs->second,0));
              local_2a4 = local_2a4 & 0xff;
              if (local_2a0[0] != (ostringstream)0x0) {
                local_2a4 = (uint)local_2a0[1];
              }
              if (local_2a0[0] == (ostringstream)0x1) {
                if ((local_2d0->autoPlay)._attrib.has_value_ == false) {
                  (local_2d0->autoPlay)._attrib.contained = SUB41(local_2a4,0);
                  (local_2d0->autoPlay)._attrib.has_value_ = true;
                }
                else {
                  (local_2d0->autoPlay)._attrib.contained = SUB41(local_2a4,0);
                }
                goto LAB_00184189;
              }
              crate::CrateValue::get_value<std::__cxx11::string>
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_2a0,&__rhs->second);
              local_318[0] = (string)local_2a0[0];
              if (local_2a0[0] == (ostringstream)0x1) {
                if ((undefined1 *)local_298._0_8_ == auStack_288) {
                  paStack_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(asStack_280._4_4_,
                                            CONCAT22(asStack_280._2_2_,
                                                     CONCAT11(asStack_280[1],asStack_280[0])));
                  local_310 = (undefined1  [8])sVar12;
                }
                else {
                  local_310 = (undefined1  [8])local_298._0_8_;
                }
                local_308._8_8_ = auStack_288;
                local_308._M_allocated_capacity = local_298._8_8_;
                local_298._8_8_ = (storage_t<double>)0x0;
                auStack_288 = (undefined1  [8])((ulong)auStack_288 & 0xffffffffffffff00);
                local_298._0_8_ = auStack_288;
              }
              if (local_2a0[0] != (ostringstream)0x1) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
                poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0x67e);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                pvVar2 = (__rhs->second).value_.v_.vtable;
                if (pvVar2 == (vtable_type *)0x0) {
                  local_2c8.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
                  local_2c8._M_string_length = 4;
                  local_2c8.field_2._M_allocated_capacity._4_4_ =
                       local_2c8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
                }
                else {
                  (*pvVar2->type_name)(&local_2c8);
                }
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_368,
                                 "`autoPlay` value must be bool type or string type, but got \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_2c8);
                psVar18 = (storage_t<double> *)::std::__cxx11::string::append((char *)&local_368);
                sVar23 = (storage_t<double>)(psVar18 + 2);
                if (*psVar18 == sVar23) {
                  local_338 = *(storage_t<double> *)sVar23;
                  sStack_330 = psVar18[3];
                  local_348 = (storage_t<double>)&local_338;
                }
                else {
                  local_338 = *(storage_t<double> *)sVar23;
                  local_348 = *psVar18;
                }
                sStack_340 = psVar18[1];
                *psVar18 = sVar23;
                psVar18[1] = (storage_t<double>)0x0;
                *(undefined1 *)(psVar18 + 2) = 0;
                poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2a0,(char *)local_348,(long)sStack_340);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                if (local_348 != (storage_t<double>)&local_338) {
                  operator_delete((void *)local_348,(long)local_338 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_dataplus._M_p != &local_368.field_2) {
                  operator_delete(local_368._M_dataplus._M_p,
                                  local_368.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                  operator_delete(local_2c8._M_dataplus._M_p,
                                  CONCAT44(local_2c8.field_2._M_allocated_capacity._4_4_,
                                           local_2c8.field_2._M_allocated_capacity._0_4_) + 1);
                }
                ::std::__cxx11::stringbuf::str();
                PushError(local_2d8,(string *)&local_348);
                if (local_348 != (storage_t<double>)&local_338) {
                  operator_delete((void *)local_348,(long)local_338 + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
                ::std::ios_base::~ios_base(local_230);
                goto joined_r0x00185d98;
              }
              iVar16 = ::std::__cxx11::string::compare(local_310);
              if (iVar16 != 0) {
                if (local_318[0] != (string)0x0) {
                  iVar16 = ::std::__cxx11::string::compare(local_310);
                  if (iVar16 == 0) {
                    sVar15 = (storage_t<bool>)0x0;
                    goto LAB_00184acc;
                  }
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3)
                  ;
                  poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0x677);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,"Unsupported value for `autoPlay`: ",0x22);
                  if (local_318[0] != (string)0x0) {
                    poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2a0,(char *)local_310,
                                         local_308._M_allocated_capacity);
                    goto LAB_00185b21;
                  }
                }
LAB_0018650e:
                pcVar27 = 
                "value_type &nonstd::optional_lite::optional<std::basic_string<char>>::value() [T = std::basic_string<char>]"
                ;
LAB_0018653a:
                __assert_fail("has_value()",
                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                              ,0x591,pcVar27);
              }
              sVar15 = (storage_t<bool>)0x1;
LAB_00184acc:
              if ((local_2d0->autoPlay)._attrib.has_value_ == false) {
                (local_2d0->autoPlay)._attrib.contained = sVar15;
                (local_2d0->autoPlay)._attrib.has_value_ = true;
              }
              else {
                (local_2d0->autoPlay)._attrib.contained = sVar15;
              }
              goto LAB_00183587;
            }
            iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
            if (iVar16 == 0) {
              crate::CrateValue::get_value<tinyusdz::Token>
                        ((optional<tinyusdz::Token> *)local_2a0,&__rhs->second);
              local_318[0] = (string)local_2a0[0];
              if (local_2a0[0] == (ostringstream)0x1) {
                if ((undefined1 *)local_298._0_8_ == auStack_288) {
                  paStack_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(asStack_280._4_4_,
                                            CONCAT22(asStack_280._2_2_,
                                                     CONCAT11(asStack_280[1],asStack_280[0])));
                  local_310 = (undefined1  [8])sVar12;
                }
                else {
                  local_310 = (undefined1  [8])local_298._0_8_;
                }
                local_308._8_8_ = auStack_288;
                local_308._M_allocated_capacity = local_298._8_8_;
                local_298._8_8_ = (storage_t<double>)0x0;
                auStack_288 = (undefined1  [8])((ulong)auStack_288 & 0xffffffffffffff00);
                local_298._0_8_ = auStack_288;
              }
              if (local_2a0[0] == (ostringstream)0x1) {
                iVar16 = ::std::__cxx11::string::compare(local_310);
                if (iVar16 == 0) {
                  if ((local_2d0->playbackMode)._attrib.has_value_ == false) {
                    (local_2d0->playbackMode)._attrib.contained =
                         (storage_t<tinyusdz::LayerMetas::PlaybackMode>)0x0;
LAB_00184e82:
                    (local_2d0->playbackMode)._attrib.has_value_ = true;
                  }
                  else {
                    (local_2d0->playbackMode)._attrib.contained =
                         (storage_t<tinyusdz::LayerMetas::PlaybackMode>)0x0;
                  }
                }
                else {
                  if (local_318[0] == (string)0x0) {
                    pcVar27 = 
                    "value_type &nonstd::optional_lite::optional<tinyusdz::Token>::value() [T = tinyusdz::Token]"
                    ;
                    goto LAB_0018653a;
                  }
                  iVar16 = ::std::__cxx11::string::compare(local_310);
                  if (iVar16 != 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a0,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a0,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                               ,0x55);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a0,"():",3);
                    poVar17 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_2a0,0x688);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                    pcVar27 = "Unsupported token value for `playbackMode`.";
                    lVar30 = 0x2b;
                    goto LAB_00185b0a;
                  }
                  if ((local_2d0->playbackMode)._attrib.has_value_ == false) {
                    (local_2d0->playbackMode)._attrib.contained =
                         (storage_t<tinyusdz::LayerMetas::PlaybackMode>)0x1;
                    goto LAB_00184e82;
                  }
                  (local_2d0->playbackMode)._attrib.contained =
                       (storage_t<tinyusdz::LayerMetas::PlaybackMode>)0x1;
                }
                goto LAB_00183587;
              }
              crate::CrateValue::get_value<std::__cxx11::string>
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_2a0,&__rhs->second);
              local_348._0_1_ = local_2a0[0];
              if (local_2a0[0] == (ostringstream)0x1) {
                sStack_340 = (storage_t<double>)&sStack_330;
                if ((undefined1 *)local_298._0_8_ == auStack_288) {
                  uStack_328 = CONCAT44(asStack_280._4_4_,
                                        CONCAT22(asStack_280._2_2_,
                                                 CONCAT11(asStack_280[1],asStack_280[0])));
                }
                else {
                  sStack_340 = (storage_t<double>)local_298._0_8_;
                }
                sStack_330 = (storage_t<double>)auStack_288;
                local_338 = (storage_t<double>)local_298._8_8_;
                local_298._8_8_ = (storage_t<double>)0x0;
                auStack_288 = (undefined1  [8])((ulong)auStack_288 & 0xffffffffffffff00);
                local_298._0_8_ = auStack_288;
              }
              if (local_2a0[0] != (ostringstream)0x1) {
                paVar20 = &local_368.field_2;
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
                poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0x698);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                pvVar2 = (__rhs->second).value_.v_.vtable;
                if (pvVar2 == (vtable_type *)0x0) {
                  local_c8.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
                  local_c8._M_string_length = 4;
                  local_c8.field_2._M_allocated_capacity._4_4_ =
                       local_c8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                }
                else {
                  (*pvVar2->type_name)(&local_c8);
                }
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_2c8,"`playbackMode` value must be token type, but got \'"
                                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_c8);
                plVar19 = (long *)::std::__cxx11::string::append((char *)&local_2c8);
                psVar22 = (size_type *)(plVar19 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar19 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar22) {
                  local_368.field_2._M_allocated_capacity = *psVar22;
                  local_368.field_2._8_8_ = plVar19[3];
                  local_368._M_dataplus._M_p = (pointer)paVar20;
                }
                else {
                  local_368.field_2._M_allocated_capacity = *psVar22;
                  local_368._M_dataplus._M_p = (pointer)*plVar19;
                }
                local_368._M_string_length = plVar19[1];
                *plVar19 = (long)psVar22;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2a0,local_368._M_dataplus._M_p,
                                     local_368._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_dataplus._M_p != paVar20) {
                  operator_delete(local_368._M_dataplus._M_p,
                                  local_368.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                  operator_delete(local_2c8._M_dataplus._M_p,
                                  CONCAT44(local_2c8.field_2._M_allocated_capacity._4_4_,
                                           local_2c8.field_2._M_allocated_capacity._0_4_) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  CONCAT44(local_c8.field_2._M_allocated_capacity._4_4_,
                                           local_c8.field_2._M_allocated_capacity._0_4_) + 1);
                }
                ::std::__cxx11::stringbuf::str();
                PushError(local_2d8,&local_368);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_dataplus._M_p != paVar20) {
LAB_001864b0:
                  operator_delete(local_368._M_dataplus._M_p,
                                  local_368.field_2._M_allocated_capacity + 1);
                }
LAB_001864bd:
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
                ::std::ios_base::~ios_base(local_230);
                if ((local_348._0_1_ == '\x01') && (sStack_340 != (storage_t<double>)&sStack_330)) {
                  operator_delete((void *)sStack_340,(long)sStack_330 + 1);
                }
                goto LAB_00185b86;
              }
              iVar16 = ::std::__cxx11::string::compare((char *)&sStack_340);
              if (iVar16 == 0) {
                if ((local_2d0->playbackMode)._attrib.has_value_ == false) {
                  (local_2d0->playbackMode)._attrib.contained =
                       (storage_t<tinyusdz::LayerMetas::PlaybackMode>)0x0;
LAB_00184e98:
                  (local_2d0->playbackMode)._attrib.has_value_ = true;
                }
                else {
                  (local_2d0->playbackMode)._attrib.contained =
                       (storage_t<tinyusdz::LayerMetas::PlaybackMode>)0x0;
                }
LAB_00184e9f:
                if ((local_348._0_1_ == '\x01') &&
                   (sVar23 = sStack_330, sVar26 = sStack_340,
                   sStack_340 != (storage_t<double>)&sStack_330)) goto LAB_0018357f;
                goto LAB_00183587;
              }
              if (local_348._0_1_ != '\0') {
                iVar16 = ::std::__cxx11::string::compare((char *)&sStack_340);
                if (iVar16 == 0) {
                  if ((local_2d0->playbackMode)._attrib.has_value_ == false) {
                    (local_2d0->playbackMode)._attrib.contained =
                         (storage_t<tinyusdz::LayerMetas::PlaybackMode>)0x1;
                    goto LAB_00184e98;
                  }
                  (local_2d0->playbackMode)._attrib.contained =
                       (storage_t<tinyusdz::LayerMetas::PlaybackMode>)0x1;
                  goto LAB_00184e9f;
                }
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
                poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0x692);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,"Unsupported value for `playbackMode`: ",0x26);
                if (local_348._0_1_ != '\0') {
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2a0,(char *)sStack_340,(long)local_338);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  PushError(local_2d8,&local_368);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_368._M_dataplus._M_p != &local_368.field_2) goto LAB_001864b0;
                  goto LAB_001864bd;
                }
              }
              goto LAB_0018650e;
            }
            iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
            if (iVar16 == 0) {
              crate::CrateValue::get_value<tinyusdz::Token>
                        ((optional<tinyusdz::Token> *)local_2a0,&__rhs->second);
              sVar29 = (string)local_2a0[0];
              local_318[0] = (string)local_2a0[0];
              if (local_2a0[0] == (ostringstream)0x1) {
                if ((undefined1 *)local_298._0_8_ == auStack_288) {
                  paStack_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(asStack_280._4_4_,
                                            CONCAT22(asStack_280._2_2_,
                                                     CONCAT11(asStack_280[1],asStack_280[0])));
                  local_310 = (undefined1  [8])sVar12;
                }
                else {
                  local_310 = (undefined1  [8])local_298._0_8_;
                }
                local_308._8_8_ = auStack_288;
                local_308._M_allocated_capacity = local_298._8_8_;
                local_298._8_8_ = (storage_t<double>)0x0;
                auStack_288 = (undefined1  [8])((ulong)auStack_288 & 0xffffffffffffff00);
                local_298._0_8_ = auStack_288;
              }
              if (local_2a0[0] == (ostringstream)0x0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
                poVar17 = (ostream *)
                          ::std::ostream::operator<<
                                    ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                      *)local_2a0,0x69d);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a0,"`defaultPrim` must be `token` type.",0x23);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\n",1);
LAB_00184ccd:
                ::std::__cxx11::stringbuf::str();
                PushError(local_2d8,(string *)&local_348);
                if (local_348 != (storage_t<double>)&local_338) {
                  operator_delete((void *)local_348,(long)local_338 + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
                ::std::ios_base::~ios_base(local_230);
              }
              else {
                ::std::__cxx11::string::_M_assign(local_50);
              }
LAB_00184d2a:
              if ((local_318[0] == (string)0x1) && ((storage_t<double>)local_310 != sVar12)) {
                uVar21 = local_308._8_8_ + 1;
                goto LAB_001843ff;
              }
            }
            else {
              iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
              if (iVar16 == 0) {
                crate::CrateValue::
                get_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                          ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                            *)local_2a0,&__rhs->second);
                puVar11 = (undefined1 *)CONCAT44(asStack_280._4_4_,asStack_280._8_4_);
                local_318[0] = (string)local_2a0[0];
                if (local_2a0[0] == (ostringstream)0x1) {
                  if ((storage_t<double>)auStack_288 == (storage_t<double>)0x0) {
                    local_308._M_allocated_capacity =
                         (ulong)(uint)local_308._M_allocated_capacity._4_4_ << 0x20;
                    local_308._8_8_ = (storage_t<double>)0x0;
                    paStack_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)(local_310 + 8);
                    paVar20 = &local_2e8;
                    paStack_2f0 = paStack_2f8;
                  }
                  else {
                    local_308._M_allocated_capacity._0_4_ = local_298._8_4_;
                    local_308._8_8_ = auStack_288;
                    paStack_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT44(asStack_280._4_4_,
                                              CONCAT22(asStack_280._2_2_,
                                                       CONCAT11(asStack_280[1],asStack_280[0])));
                    paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT44(asStack_280._12_4_,asStack_280._8_4_);
                    *(undefined1 **)((long)auStack_288 + 8) = local_310 + 8;
                    local_2e8._M_allocated_capacity =
                         CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]);
                    auStack_288 = (undefined1  [8])0x0;
                    puVar11 = local_298 + 8;
                    asStack_280[0] = SUB81(puVar11,0);
                    asStack_280[1] = SUB81((ulong)puVar11 >> 8,0);
                    asStack_280._2_2_ = (undefined2)((ulong)puVar11 >> 0x10);
                    asStack_280._4_4_ = (undefined4)((ulong)puVar11 >> 0x20);
                    paVar20 = &local_270;
                    asStack_280._12_4_ = asStack_280._4_4_;
                  }
                  asStack_280._4_4_ = (undefined4)((ulong)puVar11 >> 0x20);
                  asStack_280._8_4_ = SUB84(puVar11,0);
                  paVar20->_M_allocated_capacity = 0;
                  ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                              *)local_298,(_Link_type)auStack_288);
                }
                sVar29 = local_318[0];
                if (local_318[0] == (string)0x1) {
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                               *)local_58,
                              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                               *)local_310);
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3)
                  ;
                  poVar17 = (ostream *)
                            ::std::ostream::operator<<
                                      ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                        *)local_2a0,0x6a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  pvVar2 = (__rhs->second).value_.v_.vtable;
                  if (pvVar2 == (vtable_type *)0x0) {
                    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
                    local_368._M_string_length = 4;
                    local_368.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
                  }
                  else {
                    (*pvVar2->type_name)(&local_368);
                  }
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_348,
                                   "customLayerData must be `dictionary` type, but got type `",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_368);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2a0,(char *)local_348,(long)sStack_340);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                  if (local_348 != (storage_t<double>)&local_338) {
                    operator_delete((void *)local_348,(long)local_338 + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_368._M_dataplus._M_p != &local_368.field_2) {
                    operator_delete(local_368._M_dataplus._M_p,
                                    local_368.field_2._M_allocated_capacity + 1);
                  }
                  ::std::__cxx11::stringbuf::str();
                  PushError(local_2d8,(string *)&local_348);
                  if (local_348 != (storage_t<double>)&local_338) {
                    operator_delete((void *)local_348,(long)local_338 + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
                  ::std::ios_base::~ios_base(local_230);
                }
                if (local_318[0] == (string)0x1) {
                  ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                              *)local_310,(_Link_type)local_308._8_8_);
                }
              }
              else {
                iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
                if (iVar16 != 0) {
                  iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
                  if (iVar16 == 0) {
                    crate::CrateValue::get_value<std::__cxx11::string>
                              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_2a0,&__rhs->second);
                    sVar29 = (string)local_2a0[0];
                    local_318[0] = (string)local_2a0[0];
                    if (local_2a0[0] == (ostringstream)0x1) {
                      if ((undefined1 *)local_298._0_8_ == auStack_288) {
                        paStack_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT44(asStack_280._4_4_,
                                                  CONCAT22(asStack_280._2_2_,
                                                           CONCAT11(asStack_280[1],asStack_280[0])))
                        ;
                        local_310 = (undefined1  [8])sVar12;
                      }
                      else {
                        local_310 = (undefined1  [8])local_298._0_8_;
                      }
                      local_308._8_8_ = auStack_288;
                      local_308._M_allocated_capacity = local_298._8_8_;
                      local_298._8_8_ = (storage_t<double>)0x0;
                      auStack_288 = (undefined1  [8])((ulong)auStack_288 & 0xffffffffffffff00);
                      local_298._0_8_ = auStack_288;
                    }
                    if (local_2a0[0] == (ostringstream)0x0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                 ,0x55);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,"():",3);
                      poVar17 = (ostream *)
                                ::std::ostream::operator<<
                                          ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                            *)local_2a0,0x6b6);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                      pvVar2 = (__rhs->second).value_.v_.vtable;
                      if (pvVar2 == (vtable_type *)0x0) {
                        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
                        local_368._M_string_length = 4;
                        local_368.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
                      }
                      else {
                        (*pvVar2->type_name)(&local_368);
                      }
                      pcVar27 = "Type must be `string` for `documentation`, but got ";
LAB_0018561d:
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&local_348,pcVar27,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&local_368);
                      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_2a0,(char *)local_348,(long)sStack_340);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                      if (local_348 != (storage_t<double>)&local_338) {
                        operator_delete((void *)local_348,(long)local_338 + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_368._M_dataplus._M_p != &local_368.field_2) {
                        operator_delete(local_368._M_dataplus._M_p,
                                        local_368.field_2._M_allocated_capacity + 1);
                      }
                      goto LAB_00184ccd;
                    }
                    local_2a0 = (undefined1  [8])(local_298 + 8);
                    local_298._0_8_ = (storage_t<double>)0x0;
                    local_298._8_8_ = local_298._8_8_ & 0xffffffffffffff00;
                    asStack_280[0] = (string)0x0;
                    asStack_280[1] = (string)0x0;
                    asStack_280[4] = (string)0x0;
                    asStack_280[5] = (string)0x0;
                    asStack_280[6] = (string)0x0;
                    asStack_280[7] = (string)0x0;
                    asStack_280[8] = (string)0x0;
                    asStack_280[9] = (string)0x0;
                    asStack_280[10] = (string)0x0;
                    asStack_280[0xb] = (string)0x0;
                    ::std::__cxx11::string::_M_assign((string *)local_2a0);
                    asStack_280[0] =
                         (string)((storage_t<double>)local_298._0_8_ != (storage_t<double>)0x0);
                    if ((bool)asStack_280[0]) {
                      asStack_280[0] = (string)0x1;
                      sVar23 = (storage_t<double>)0x1;
                      do {
                        if ((*(char *)((long)local_2a0 + (long)sVar23 + -1) == '\n') ||
                           (*(char *)((long)local_2a0 + (long)sVar23 + -1) == '\r')) break;
                        asStack_280[0] = (string)((ulong)sVar23 < (ulong)local_298._0_8_);
                        bVar32 = sVar23 != (storage_t<double>)local_298._0_8_;
                        sVar23 = (storage_t<double>)((long)sVar23 + 1);
                      } while (bVar32);
                    }
                    ::std::__cxx11::string::_M_assign(local_68);
                    pbVar24 = local_70;
                  }
                  else {
                    iVar16 = ::std::__cxx11::string::compare((char *)__rhs);
                    if (iVar16 != 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                 ,0x55);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,"():",3);
                      poVar17 = (ostream *)
                                ::std::ostream::operator<<
                                          ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                            *)local_2a0,0x6c9);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_318,"[StageMeta] TODO: ",&__rhs->first);
                      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_2a0,(char *)local_318,(long)local_310);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                      if (local_318 != (undefined1  [8])(local_310 + 8)) {
                        operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
                      }
                      ::std::__cxx11::stringbuf::str();
                      PushWarn(local_2d8,(string *)local_318);
                      if (local_318 != (undefined1  [8])(local_310 + 8)) {
                        operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
                      ::std::ios_base::~ios_base(local_230);
                      goto LAB_00184189;
                    }
                    crate::CrateValue::get_value<std::__cxx11::string>
                              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_2a0,&__rhs->second);
                    sVar29 = (string)local_2a0[0];
                    local_318[0] = (string)local_2a0[0];
                    if (local_2a0[0] == (ostringstream)0x1) {
                      if ((undefined1 *)local_298._0_8_ == auStack_288) {
                        paStack_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT44(asStack_280._4_4_,
                                                  CONCAT22(asStack_280._2_2_,
                                                           CONCAT11(asStack_280[1],asStack_280[0])))
                        ;
                        local_310 = (undefined1  [8])sVar12;
                      }
                      else {
                        local_310 = (undefined1  [8])local_298._0_8_;
                      }
                      local_308._8_8_ = auStack_288;
                      local_308._M_allocated_capacity = local_298._8_8_;
                      local_298._8_8_ = (storage_t<double>)0x0;
                      auStack_288 = (undefined1  [8])((ulong)auStack_288 & 0xffffffffffffff00);
                      local_298._0_8_ = auStack_288;
                    }
                    if (local_2a0[0] == (ostringstream)0x0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                 ,0x55);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a0,"():",3);
                      poVar17 = (ostream *)
                                ::std::ostream::operator<<
                                          ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                            *)local_2a0,0x6c1);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                      pvVar2 = (__rhs->second).value_.v_.vtable;
                      if (pvVar2 == (vtable_type *)0x0) {
                        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
                        local_368._M_string_length = 4;
                        local_368.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
                      }
                      else {
                        (*pvVar2->type_name)(&local_368);
                      }
                      pcVar27 = "Type must be `string` for `comment`, but got ";
                      goto LAB_0018561d;
                    }
                    local_2a0 = (undefined1  [8])(local_298 + 8);
                    local_298._0_8_ = (storage_t<double>)0x0;
                    local_298._8_8_ = local_298._8_8_ & 0xffffffffffffff00;
                    asStack_280[0] = (string)0x0;
                    asStack_280[1] = (string)0x0;
                    asStack_280[4] = (string)0x0;
                    asStack_280[5] = (string)0x0;
                    asStack_280[6] = (string)0x0;
                    asStack_280[7] = (string)0x0;
                    asStack_280[8] = (string)0x0;
                    asStack_280[9] = (string)0x0;
                    asStack_280[10] = (string)0x0;
                    asStack_280[0xb] = (string)0x0;
                    ::std::__cxx11::string::_M_assign((string *)local_2a0);
                    asStack_280[0] =
                         (string)((storage_t<double>)local_298._0_8_ != (storage_t<double>)0x0);
                    if ((bool)asStack_280[0]) {
                      asStack_280[0] = (string)0x1;
                      sVar23 = (storage_t<double>)0x1;
                      do {
                        if ((*(char *)((long)local_2a0 + (long)sVar23 + -1) == '\n') ||
                           (*(char *)((long)local_2a0 + (long)sVar23 + -1) == '\r')) break;
                        asStack_280[0] = (string)((ulong)sVar23 < (ulong)local_298._0_8_);
                        bVar32 = sVar23 != (storage_t<double>)local_298._0_8_;
                        sVar23 = (storage_t<double>)((long)sVar23 + 1);
                      } while (bVar32);
                    }
                    ::std::__cxx11::string::_M_assign(local_78);
                    pbVar24 = local_80;
                  }
                  *(undefined4 *)(pbVar24 + 8) = asStack_280._8_4_;
                  *(ulong *)pbVar24 =
                       CONCAT44(asStack_280._4_4_,
                                CONCAT22(asStack_280._2_2_,CONCAT11(asStack_280[1],asStack_280[0])))
                  ;
                  if (local_2a0 != (undefined1  [8])(local_298 + 8)) {
                    operator_delete((void *)local_2a0,local_298._8_8_ + 1);
                  }
                  goto LAB_00184d2a;
                }
                crate::CrateValue::
                get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                          ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                            *)local_2a0,&__rhs->second);
                local_318[0] = (string)local_2a0[0];
                if (local_2a0[0] == (ostringstream)0x1) {
                  local_310 = (undefined1  [8])local_298._0_8_;
                  local_308._M_allocated_capacity = local_298._8_8_;
                  local_308._8_8_ = auStack_288;
                  local_298._0_8_ = (storage_t<double>)0x0;
                  local_298._8_8_ = (storage_t<double>)0x0;
                  auStack_288 = (undefined1  [8])0x0;
                  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_298)
                  ;
                }
                sVar29 = local_318[0];
                if (local_318[0] == (string)0x0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3)
                  ;
                  poVar17 = (ostream *)
                            ::std::ostream::operator<<
                                      ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                        *)local_2a0,0x6ae);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
                  pvVar2 = (__rhs->second).value_.v_.vtable;
                  if (pvVar2 == (vtable_type *)0x0) {
                    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
                    local_368._M_string_length = 4;
                    local_368.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
                  }
                  else {
                    (*pvVar2->type_name)(&local_368);
                  }
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_348,
                                   "Type must be `token[]` for `primChildren`, but got ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_368);
                  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2a0,(char *)local_348,(long)sStack_340);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                  if (local_348 != (storage_t<double>)&local_338) {
                    operator_delete((void *)local_348,(long)local_338 + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_368._M_dataplus._M_p != &local_368.field_2) {
                    operator_delete(local_368._M_dataplus._M_p,
                                    local_368.field_2._M_allocated_capacity + 1);
                  }
                  ::std::__cxx11::stringbuf::str();
                  PushError(local_2d8,(string *)&local_348);
                  if (local_348 != (storage_t<double>)&local_338) {
                    operator_delete((void *)local_348,(long)local_338 + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
                  ::std::ios_base::~ios_base(local_230);
                }
                else {
                  std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_60,
                             (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_310)
                  ;
                }
                if (local_318[0] == (string)0x1) {
                  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_310)
                  ;
                }
              }
            }
            goto LAB_00184180;
          }
          tinyusdz::value::Value::get_value<float>
                    ((optional<float> *)local_2a0,&(__rhs->second).value_,false);
          if (local_2a0[0] != (ostringstream)0x0) {
            local_110 = (float)local_2a0._4_4_;
          }
          if (local_2a0[0] != (ostringstream)0x1) {
            tinyusdz::value::Value::get_value<double>
                      ((optional<double> *)local_2a0,&(__rhs->second).value_,false);
            sVar29 = (string)local_2a0[0];
            if (local_2a0[0] == (ostringstream)0x0) {
              uVar33 = (undefined4)local_a8;
              uVar34 = (undefined4)((ulong)local_a8 >> 0x20);
            }
            else {
              uVar33 = (undefined4)local_298._0_8_;
              uVar34 = SUB84(local_298._0_8_,4);
            }
            local_a8 = CONCAT44(uVar34,uVar33);
            if (local_2a0[0] != (ostringstream)0x1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2a0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
              poVar17 = (ostream *)
                        ::std::ostream::operator<<
                                  ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                    *)local_2a0,0x668);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
              pvVar2 = (__rhs->second).value_.v_.vtable;
              if (pvVar2 == (vtable_type *)0x0) {
                local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
                local_368._M_string_length = 4;
                local_368.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
              }
              else {
                (*pvVar2->type_name)(&local_368);
              }
              pcVar27 = "`framesPerSecond` value must be double or float type, but got \'";
              goto LAB_00184895;
            }
            if ((local_2d0->framesPerSecond)._attrib.has_value_ == false) {
              sVar4._4_4_ = uVar34;
              sVar4._0_4_ = uVar33;
              (local_2d0->framesPerSecond)._attrib.contained = sVar4;
              (local_2d0->framesPerSecond)._attrib.has_value_ = true;
            }
            else {
              sVar3._4_4_ = uVar34;
              sVar3._0_4_ = uVar33;
              (local_2d0->framesPerSecond)._attrib.contained = sVar3;
            }
            goto LAB_00184180;
          }
          if ((local_2d0->framesPerSecond)._attrib.has_value_ == false) {
            (local_2d0->framesPerSecond)._attrib.contained = (storage_t<double>)(double)local_110;
            (local_2d0->framesPerSecond)._attrib.has_value_ = true;
          }
          else {
            (local_2d0->framesPerSecond)._attrib.contained = (storage_t<double>)(double)local_110;
          }
        }
      }
LAB_00184189:
      __rhs = __rhs + 1;
      local_369 = __rhs == local_38;
    } while (!local_369);
  }
  if (local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if (local_128.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_128.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"[warn]",6);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a0,"ReconstrcutStageMeta",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"():",3);
      poVar17 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a0,0x6de);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a0,"Corrupted subLayer info? `subLayers` Fileld not found.",0x36)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushWarn(local_2d8,(string *)local_318);
      if (local_318 != (undefined1  [8])(local_310 + 8)) {
        operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
      ::std::ios_base::~ios_base(local_230);
    }
  }
  else {
    local_348 = (storage_t<double>)0x0;
    sStack_340 = (storage_t<double>)0x0;
    local_338 = (storage_t<double>)0x0;
    if (local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar21 = 0;
    }
    else {
      lVar30 = 8;
      uVar31 = 0;
      do {
        local_2a0 = (undefined1  [8])(local_298 + 8);
        local_298._0_8_ = (storage_t<double>)0x0;
        local_298._8_8_ = local_298._8_8_ & 0xffffffffffffff00;
        asStack_280[0] = SUB81(&local_270,0);
        asStack_280[1] = SUB81((ulong)&local_270 >> 8,0);
        asStack_280._2_2_ = (undefined2)((ulong)&local_270 >> 0x10);
        asStack_280._4_4_ = (undefined4)((ulong)&local_270 >> 0x20);
        asStack_280[8] = (string)0x0;
        asStack_280[9] = (string)0x0;
        asStack_280[10] = (string)0x0;
        asStack_280[0xb] = (string)0x0;
        asStack_280[0xc] = (string)0x0;
        asStack_280[0xd] = (string)0x0;
        asStack_280[0xe] = (string)0x0;
        asStack_280[0xf] = (string)0x0;
        local_270._M_local_buf[0] = '\0';
        local_260 = 0.0;
        local_258 = 1.0;
        local_318 = (undefined1  [8])(local_310 + 8);
        lVar25 = *(long *)((long)local_f8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar30 + -8);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_318,lVar25,
                   *(long *)((long)&((local_f8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar30) + lVar25);
        paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_2e8._M_allocated_capacity = local_2e8._M_allocated_capacity & 0xffffffffffffff00;
        paStack_2f8 = &local_2e8;
        ::std::__cxx11::string::operator=((string *)local_2a0,(string *)local_318);
        ::std::__cxx11::string::operator=(asStack_280,(string *)&paStack_2f8);
        if (paStack_2f8 != &local_2e8) {
          operator_delete(paStack_2f8,local_2e8._M_allocated_capacity + 1);
        }
        if (local_318 != (undefined1  [8])(local_310 + 8)) {
          operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
        }
        ::std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::push_back
                  ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)&local_348,
                   (value_type *)local_2a0);
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(asStack_280._4_4_,
                              CONCAT22(asStack_280._2_2_,CONCAT11(asStack_280[1],asStack_280[0])));
        if (paVar20 != &local_270) {
          operator_delete(paVar20,CONCAT71(local_270._M_allocated_capacity._1_7_,
                                           local_270._M_local_buf[0]) + 1);
        }
        if (local_2a0 != (undefined1  [8])(local_298 + 8)) {
          operator_delete((void *)local_2a0,local_298._8_8_ + 1);
        }
        uVar31 = uVar31 + 1;
        uVar21 = (long)local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar30 = lVar30 + 0x20;
      } while (uVar31 < uVar21);
    }
    if ((uVar21 == (long)local_128.
                         super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_128.
                         super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) &&
       (local_128.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_128.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
        _M_impl.super__Vector_impl_data._M_start)) {
      lVar30 = 0x40;
      lVar25 = 0;
      uVar21 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)&(local_128.
                          super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_offset + lVar25);
        uVar10 = puVar1[1];
        *(undefined8 *)((long)local_348 + lVar30) = *puVar1;
        ((undefined8 *)((long)local_348 + lVar30))[1] = uVar10;
        uVar21 = uVar21 + 1;
        lVar25 = lVar25 + 0x10;
        lVar30 = lVar30 + 0x50;
      } while (uVar21 < (ulong)((long)local_128.
                                      super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_128.
                                      super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::operator=
              ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)
               &local_2d0->subLayers,
               (vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)&local_348);
    ::std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::~vector
              ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)&local_348);
  }
LAB_00185a22:
  if (local_128.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f8);
  return local_369;
}

Assistant:

bool USDCReader::Impl::ReconstrcutStageMeta(
    const crate::FieldValuePairVector &fvs, StageMetas *metas) {
  /// Stage(toplevel layer) Meta fieldSet example.
  ///
  ///   specTy = SpecTypePseudoRoot
  ///
  ///     - subLayers(+ subLayerOffsets)
  ///     - customLayerData(dict)
  ///     - defaultPrim(token)
  ///     - metersPerUnit(double)
  ///     - kilogramsPerUnit(double)
  ///     - timeCodesPerSecond(double)
  ///     - upAxis(token)
  ///     - documentation(string) : `doc`
  ///     - comment(string) : comment
  ///     - primChildren(token[]) : Crate only. List of root prims(Root Prim should be traversed based on this array)

  std::vector<std::string> subLayers;
  std::vector<LayerOffset> subLayerOffsets;

  for (const auto &fv : fvs) {
    if (fv.first == "upAxis") {
      auto vt = fv.second.get_value<value::token>();
      if (!vt) {
        PUSH_ERROR_AND_RETURN("`upAxis` must be `token` type.");
      }

      std::string v = vt.value().str();
      if (v == "Y") {
        metas->upAxis = Axis::Y;
      } else if (v == "Z") {
        metas->upAxis = Axis::Z;
      } else if (v == "X") {
        metas->upAxis = Axis::X;
      } else {
        PUSH_ERROR_AND_RETURN("`upAxis` must be 'X', 'Y' or 'Z' but got '" + v +
                              "'(note: Case sensitive)");
      }
      DCOUT("upAxis = " << to_string(metas->upAxis.get_value()));

    } else if (fv.first == "metersPerUnit") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->metersPerUnit = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->metersPerUnit = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`metersPerUnit` value must be double or float type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("metersPerUnit = " << metas->metersPerUnit.get_value());
    } else if (fv.first == "kilogramsPerUnit") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->kilogramsPerUnit = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->kilogramsPerUnit = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`kilogramsPerUnit` value must be double or float type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("kilogramsPerUnit = " << metas->kilogramsPerUnit.get_value());
    } else if (fv.first == "timeCodesPerSecond") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->timeCodesPerSecond = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->timeCodesPerSecond = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`timeCodesPerSecond` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("timeCodesPerSecond = " << metas->timeCodesPerSecond.get_value());
    } else if (fv.first == "startTimeCode") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->startTimeCode = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->startTimeCode = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`startTimeCode` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("startimeCode = " << metas->startTimeCode.get_value());
    } else if (fv.first == "subLayers") {
      if (auto vs = fv.second.get_value<std::vector<std::string>>()) {
        subLayers = vs.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`subLayers` value must be string[] "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
    } else if (fv.first == "subLayerOffsets") {
      if (auto vs = fv.second.get_value<std::vector<LayerOffset>>()) {
        subLayerOffsets = vs.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`subLayerOffsets` value must be LayerOffset[] "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
    } else if (fv.first == "endTimeCode") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->endTimeCode = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->endTimeCode = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`endTimeCode` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("endTimeCode = " << metas->endTimeCode.get_value());
    } else if (fv.first == "framesPerSecond") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->framesPerSecond = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->framesPerSecond = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`framesPerSecond` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("framesPerSecond = " << metas->framesPerSecond.get_value());
    } else if (fv.first == "autoPlay") {
      if (auto vf = fv.second.get_value<bool>()) {
        metas->autoPlay = vf.value();
      } else if (auto vs = fv.second.get_value<std::string>()) {
        // unregisteredvalue uses string type.
        bool autoPlay{true};
        if (vs.value() == "true") {
          autoPlay = true;
        } else if (vs.value() == "false") {
          autoPlay = false;
        } else {
          PUSH_ERROR_AND_RETURN(
              "Unsupported value for `autoPlay`: " << vs.value());
        }
        metas->autoPlay = autoPlay;
      } else {
        PUSH_ERROR_AND_RETURN(
            "`autoPlay` value must be bool "
            "type or string type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("autoPlay = " << metas->autoPlay.get_value());
    } else if (fv.first == "playbackMode") {
      if (auto vf = fv.second.get_value<value::token>()) {
        if (vf.value().str() == "none") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeNone;
        } else if (vf.value().str() == "loop") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeLoop;
        } else {
          PUSH_ERROR_AND_RETURN("Unsupported token value for `playbackMode`.");
        }
      } else if (auto vs = fv.second.get_value<std::string>()) {
        // unregisteredvalue uses string type.
        if (vs.value() == "none") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeNone;
        } else if (vs.value() == "loop") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeLoop;
        } else {
          PUSH_ERROR_AND_RETURN(
              "Unsupported value for `playbackMode`: " << vs.value());
        }
      } else {
        PUSH_ERROR_AND_RETURN(
            "`playbackMode` value must be token "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
    } else if ((fv.first == "defaultPrim")) {
      auto v = fv.second.get_value<value::token>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("`defaultPrim` must be `token` type.");
      }

      metas->defaultPrim = v.value();
      DCOUT("defaultPrim = " << metas->defaultPrim.str());
    } else if (fv.first == "customLayerData") {
      if (auto v = fv.second.get_value<CustomDataType>()) {
        metas->customLayerData = v.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "customLayerData must be `dictionary` type, but got type `" +
            fv.second.type_name());
      }
    } else if (fv.first == "primChildren") {  // only appears in USDC.
      auto v = fv.second.get_value<std::vector<value::token>>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("Type must be `token[]` for `primChildren`, but got " +
                   fv.second.type_name());
      }

      metas->primChildren = v.value();
    } else if (fv.first == "documentation") {  // 'doc'
      auto v = fv.second.get_value<std::string>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("Type must be `string` for `documentation`, but got " +
                   fv.second.type_name());
      }
      value::StringData sdata;
      sdata.value = v.value();
      sdata.is_triple_quoted = hasNewline(sdata.value);
      metas->doc = sdata;
      DCOUT("doc = " << metas->doc.value);
    } else if (fv.first == "comment") {  // 'comment'
      auto v = fv.second.get_value<std::string>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("Type must be `string` for `comment`, but got " +
                   fv.second.type_name());
      }
      value::StringData sdata;
      sdata.value = v.value();
      sdata.is_triple_quoted = hasNewline(sdata.value);
      metas->comment = sdata;
      DCOUT("comment = " << metas->comment.value);
    } else {
      PUSH_WARN("[StageMeta] TODO: " + fv.first);
    }
  }

  if (subLayers.size()) {
    std::vector<SubLayer> dst;
    for (size_t i = 0; i < subLayers.size(); i++) {
      SubLayer s;
      s.assetPath = subLayers[i];
      dst.push_back(s);
    }

    if (subLayers.size() == subLayerOffsets.size()) {
      for (size_t i = 0; i < subLayerOffsets.size(); i++) {
        dst[i].layerOffset = subLayerOffsets[i];
      }
    }

    metas->subLayers = dst;

  } else if (subLayerOffsets.size()) {
    PUSH_WARN("Corrupted subLayer info? `subLayers` Fileld not found.");
  }

  return true;
}